

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestPipe::TestPipe(TestPipe *this)

{
  unsigned_long uVar1;
  TestPipe *this_local;
  
  kj::BufferedInputStream::BufferedInputStream(&this->super_BufferedInputStream);
  kj::OutputStream::OutputStream(&this->super_OutputStream);
  (this->super_BufferedInputStream).super_InputStream._vptr_InputStream =
       (_func_int **)&PTR__TestPipe_0058cb48;
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0058cb88;
  uVar1 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
  this->preferredReadSize = uVar1;
  std::__cxx11::string::string((string *)&this->data);
  this->readPos = 0;
  return;
}

Assistant:

TestPipe()
      : preferredReadSize(kj::maxValue), readPos(0) {}